

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatHeap.h
# Opt level: O1

void xSAT_HeapPercolateDown(xSAT_Heap_t *h,int i)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  
  if ((-1 < i) && (pVVar7 = h->vHeap, i < pVVar7->nSize)) {
    piVar8 = pVVar7->pArray;
    uVar1 = piVar8[(uint)i];
    do {
      uVar11 = i * 2 + 1;
      iVar2 = pVVar7->nSize;
      if (iVar2 <= (int)uVar11) {
LAB_008fae70:
        if (((-1 < i) && (i < pVVar7->nSize)) &&
           ((piVar8[(uint)i] = uVar1, -1 < (int)uVar1 && ((int)uVar1 < h->vIndices->nSize)))) {
          h->vIndices->pArray[uVar1] = i;
          return;
        }
LAB_008faeba:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      uVar10 = i * 2 + 2;
      if ((int)uVar10 < iVar2) {
        if (((int)uVar10 < 0) || (i < 0)) break;
        uVar3 = piVar8[uVar10];
        if ((int)uVar3 < 0) break;
        iVar4 = h->vActivity->nSize;
        if (iVar4 <= (int)uVar3) break;
        uVar5 = piVar8[uVar11];
        if (((int)uVar5 < 0) || (iVar4 <= (int)uVar5)) break;
        piVar9 = h->vActivity->pArray;
        if ((uint)piVar9[uVar3] <= (uint)piVar9[uVar5]) goto LAB_008fadde;
      }
      else {
LAB_008fadde:
        uVar10 = uVar11;
      }
      if (((int)uVar10 < 0) || (iVar2 <= (int)uVar10)) break;
      iVar4 = piVar8[uVar10];
      lVar12 = (long)iVar4;
      if (lVar12 < 0) break;
      iVar6 = h->vActivity->nSize;
      if (((iVar6 <= iVar4) || ((int)uVar1 < 0)) || (iVar6 <= (int)uVar1)) break;
      piVar9 = h->vActivity->pArray;
      uVar11 = piVar9[lVar12];
      uVar3 = piVar9[uVar1];
      if (uVar3 < uVar11) {
        if ((i < 0) || (iVar2 <= i)) goto LAB_008faeba;
        piVar8[(uint)i] = iVar4;
        if (pVVar7->nSize <= i) break;
        if (h->vIndices->nSize <= iVar4) goto LAB_008faeba;
        h->vIndices->pArray[lVar12] = i;
        i = uVar10;
      }
      if (uVar11 <= uVar3) goto LAB_008fae70;
    } while( true );
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline void xSAT_HeapPercolateDown( xSAT_Heap_t * h, int i )
{
    int x = Vec_IntEntry( h->vHeap, i );

    while ( Left( i ) < Vec_IntSize( h->vHeap ) )
    {
        int child = Right( i ) < Vec_IntSize( h->vHeap ) &&
                    Compare( h, Vec_IntEntry( h->vHeap, Right( i ) ), Vec_IntEntry( h->vHeap, Left( i ) ) ) ?
                    Right( i ) : Left( i );

        if ( !Compare( h, Vec_IntEntry( h->vHeap, child ), x ) )
            break;

        Vec_IntWriteEntry( h->vHeap, i, Vec_IntEntry( h->vHeap, child ) );
        Vec_IntWriteEntry( h->vIndices, Vec_IntEntry( h->vHeap, i ), i );
        i = child;
    }
    Vec_IntWriteEntry( h->vHeap, i, x );
    Vec_IntWriteEntry( h->vIndices, x, i );
}